

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O0

float __thiscall tactile::PieceWiseLinearCalib::map(PieceWiseLinearCalib *this,float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  size_type sVar8;
  pointer ppVar9;
  pointer ppVar10;
  _Rb_tree_const_iterator<std::pair<const_float,_float>_> local_50;
  const_iterator prev;
  _Self local_40;
  _Rb_tree_const_iterator<std::pair<const_float,_float>_> local_38;
  _Self local_30;
  _Self local_28;
  const_iterator next;
  float x_local;
  PieceWiseLinearCalib *this_local;
  
  next._M_node._4_4_ = x;
  sVar8 = std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>
          ::size(&this->values);
  if (1 < sVar8) {
    local_28._M_node =
         (_Base_ptr)
         std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>::
         upper_bound(&this->values,(key_type *)((long)&next._M_node + 4));
    local_30._M_node =
         (_Base_ptr)
         std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>::
         begin(&this->values);
    bVar7 = std::operator==(&local_28,&local_30);
    if (bVar7) {
      local_38._M_node =
           (_Base_ptr)
           std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>
           ::begin(&this->values);
      ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->(&local_38);
      this_local._4_4_ = ppVar10->second;
    }
    else {
      local_40._M_node =
           (_Base_ptr)
           std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>
           ::end(&this->values);
      bVar7 = std::operator==(&local_28,&local_40);
      if (bVar7) {
        std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>::
        rbegin((map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>
                *)&prev);
        ppVar9 = std::
                 reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>_>::
                 operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>_>
                             *)&prev);
        this_local._4_4_ = ppVar9->second;
      }
      else {
        local_50._M_node = local_28._M_node;
        std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator--(&local_50);
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_50);
        fVar6 = next._M_node._4_4_;
        fVar1 = ppVar10->second;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_50);
        fVar2 = ppVar10->first;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_28);
        fVar3 = ppVar10->first;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_50);
        fVar4 = ppVar10->first;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_28);
        fVar5 = ppVar10->second;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_float,_float>_>::operator->
                            (&local_50);
        this_local._4_4_ = ((fVar6 - fVar2) / (fVar3 - fVar4)) * (fVar5 - ppVar10->second) + fVar1;
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("values.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ubi-agni[P]tactile_filters/PieceWiseLinearCalib.cpp"
                ,0x30,"virtual float tactile::PieceWiseLinearCalib::map(float) const");
}

Assistant:

float PieceWiseLinearCalib::map(float x) const
{
	assert(values.size() > 1);
	// retrieve first key that is larger than x
	CalibrationMap::const_iterator next = values.upper_bound(x);
	// if x is smaller than key range, clip to smallest value
	if (next == values.begin()) return values.begin()->second;
	// if x is larger than key range, clip to largest value
	if (next == values.end()) return values.rbegin()->second;
	CalibrationMap::const_iterator prev = next;
	--prev;
	return prev->second +
	       (x - prev->first) / (next->first - prev->first) * (next->second - prev->second);
}